

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::SWAP(SWAP<std::complex<float>_> *this,int *qubits)

{
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004d0910;
  setQubits(this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }